

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

char * ImGui::SaveIniSettingsToMemory(size_t *out_size)

{
  ImGuiTextBuffer *this;
  ImGuiContext *pIVar1;
  int iVar2;
  ImGuiSettingsHandler *pIVar3;
  char *pcVar4;
  int handler_n;
  int iVar5;
  char local_29;
  
  pIVar1 = GImGui;
  GImGui->SettingsDirtyTimer = 0.0;
  this = &pIVar1->SettingsIniData;
  ImVector<char>::resize(&this->Buf,0);
  local_29 = '\0';
  ImVector<char>::push_back(&this->Buf,&local_29);
  for (iVar5 = 0; iVar5 < (pIVar1->SettingsHandlers).Size; iVar5 = iVar5 + 1) {
    pIVar3 = ImVector<ImGuiSettingsHandler>::operator[](&pIVar1->SettingsHandlers,iVar5);
    (*pIVar3->WriteAllFn)(pIVar1,pIVar3,this);
  }
  if (out_size != (size_t *)0x0) {
    iVar5 = (this->Buf).Size;
    iVar2 = iVar5 + -1;
    if (iVar5 == 0) {
      iVar2 = 0;
    }
    *out_size = (long)iVar2;
  }
  pcVar4 = (pIVar1->SettingsIniData).Buf.Data;
  if (pcVar4 == (char *)0x0) {
    pcVar4 = ImGuiTextBuffer::EmptyString;
  }
  return pcVar4;
}

Assistant:

const char* ImGui::SaveIniSettingsToMemory(size_t* out_size)
{
    ImGuiContext& g = *GImGui;
    g.SettingsDirtyTimer = 0.0f;
    g.SettingsIniData.Buf.resize(0);
    g.SettingsIniData.Buf.push_back(0);
    for (int handler_n = 0; handler_n < g.SettingsHandlers.Size; handler_n++)
    {
        ImGuiSettingsHandler* handler = &g.SettingsHandlers[handler_n];
        handler->WriteAllFn(&g, handler, &g.SettingsIniData);
    }
    if (out_size)
        *out_size = (size_t)g.SettingsIniData.size();
    return g.SettingsIniData.c_str();
}